

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_78::BinaryReaderIR::OnExport
          (BinaryReaderIR *this,Index index,ExternalKind kind,Index item_index,string_view name)

{
  Export *this_00;
  ExportModuleField *pEVar1;
  _Head_base<0UL,_wabt::ExportModuleField_*,_false> local_b8;
  ExportModuleField *local_b0;
  string_view local_a8;
  Var local_98;
  Location local_50;
  
  local_a8.size_ = name.size_;
  local_a8.data_ = name.data_;
  GetLocation(&local_98.loc,this);
  MakeUnique<wabt::ExportModuleField,wabt::Location>((wabt *)&local_b0,&local_98.loc);
  pEVar1 = local_b0;
  this_00 = &local_b0->export_;
  string_view::to_string_abi_cxx11_((string *)&local_98,&local_a8);
  std::__cxx11::string::operator=((string *)this_00,(string *)&local_98);
  std::__cxx11::string::_M_dispose();
  GetLocation(&local_50,this);
  Var::Var(&local_98,item_index,&local_50);
  Var::operator=(&(pEVar1->export_).var,&local_98);
  Var::~Var(&local_98);
  (pEVar1->export_).kind = kind;
  local_b8._M_head_impl = local_b0;
  local_b0 = (ExportModuleField *)0x0;
  Module::AppendField(this->module_,
                      (unique_ptr<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_>
                       *)&local_b8);
  if (local_b8._M_head_impl != (ExportModuleField *)0x0) {
    (*((local_b8._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)3>).super_ModuleField.
      _vptr_ModuleField[1])();
  }
  local_b8._M_head_impl = (ExportModuleField *)0x0;
  if (local_b0 != (ExportModuleField *)0x0) {
    (**(code **)(*(long *)local_b0 + 8))();
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::OnExport(Index index,
                                ExternalKind kind,
                                Index item_index,
                                string_view name) {
  auto field = MakeUnique<ExportModuleField>(GetLocation());
  Export& export_ = field->export_;
  export_.name = name.to_string();
  export_.var = Var(item_index, GetLocation());
  export_.kind = kind;
  module_->AppendField(std::move(field));
  return Result::Ok;
}